

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct32_high28_stage6_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  __m128i alVar1;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  undefined1 auVar2 [16];
  __m128i alVar3;
  undefined1 auVar4 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i alVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  __m128i alVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar5 [16];
  undefined1 auVar10 [16];
  undefined1 auVar15 [16];
  undefined1 auVar20 [16];
  undefined1 auVar6 [16];
  undefined1 auVar11 [16];
  undefined1 auVar16 [16];
  undefined1 auVar21 [16];
  undefined1 auVar7 [16];
  undefined1 auVar12 [16];
  undefined1 auVar17 [16];
  undefined1 auVar22 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  alVar30 = x[5];
  alVar3 = x[8];
  alVar1 = x[9];
  auVar27._0_12_ = alVar30._0_12_;
  auVar27._12_2_ = alVar30[0]._6_2_;
  auVar27._14_2_ = *(undefined2 *)((long)x[6] + 6);
  auVar26._12_4_ = auVar27._12_4_;
  auVar26._0_10_ = alVar30._0_10_;
  auVar26._10_2_ = *(undefined2 *)((long)x[6] + 4);
  auVar25._10_6_ = auVar26._10_6_;
  auVar25._0_8_ = alVar30[0];
  auVar25._8_2_ = alVar30[0]._4_2_;
  auVar24._8_8_ = auVar25._8_8_;
  auVar24._6_2_ = *(undefined2 *)((long)x[6] + 2);
  auVar24._4_2_ = alVar30[0]._2_2_;
  auVar24._0_2_ = (undefined2)alVar30[0];
  auVar24._2_2_ = (short)x[6][0];
  auVar42._2_2_ = (short)x[6][1];
  auVar42._0_2_ = (short)alVar30[1];
  auVar42._4_2_ = alVar30[1]._2_2_;
  auVar42._6_2_ = *(undefined2 *)((long)x[6] + 10);
  auVar42._8_2_ = alVar30[1]._4_2_;
  auVar42._10_2_ = *(undefined2 *)((long)x[6] + 0xc);
  auVar42._12_2_ = alVar30[1]._6_2_;
  auVar42._14_2_ = *(undefined2 *)((long)x[6] + 0xe);
  auVar39._8_4_ = 0xb50f4b0;
  auVar39._0_8_ = 0xb50f4b00b50f4b0;
  auVar39._12_4_ = 0xb50f4b0;
  auVar47 = pmaddwd(auVar24,auVar39);
  auVar40 = pmaddwd(auVar39,auVar42);
  auVar54._8_4_ = 0xb500b50;
  auVar54._0_8_ = 0xb500b500b500b50;
  auVar54._12_4_ = 0xb500b50;
  auVar28 = pmaddwd(auVar24,auVar54);
  auVar2 = pmaddwd(auVar42,auVar54);
  auVar48._0_4_ = auVar47._0_4_ + in_XMM0_Da >> 0xc;
  auVar48._4_4_ = auVar47._4_4_ + in_XMM0_Db >> 0xc;
  auVar48._8_4_ = auVar47._8_4_ + in_XMM0_Dc >> 0xc;
  auVar48._12_4_ = auVar47._12_4_ + in_XMM0_Dd >> 0xc;
  auVar41._0_4_ = auVar40._0_4_ + in_XMM0_Da >> 0xc;
  auVar41._4_4_ = auVar40._4_4_ + in_XMM0_Db >> 0xc;
  auVar41._8_4_ = auVar40._8_4_ + in_XMM0_Dc >> 0xc;
  auVar41._12_4_ = auVar40._12_4_ + in_XMM0_Dd >> 0xc;
  alVar49 = (__m128i)packssdw(auVar48,auVar41);
  auVar29._0_4_ = auVar28._0_4_ + in_XMM0_Da >> 0xc;
  auVar29._4_4_ = auVar28._4_4_ + in_XMM0_Db >> 0xc;
  auVar29._8_4_ = auVar28._8_4_ + in_XMM0_Dc >> 0xc;
  auVar29._12_4_ = auVar28._12_4_ + in_XMM0_Dd >> 0xc;
  auVar50._0_4_ = auVar2._0_4_ + in_XMM0_Da >> 0xc;
  auVar50._4_4_ = auVar2._4_4_ + in_XMM0_Db >> 0xc;
  auVar50._8_4_ = auVar2._8_4_ + in_XMM0_Dc >> 0xc;
  auVar50._12_4_ = auVar2._12_4_ + in_XMM0_Dd >> 0xc;
  alVar30 = (__m128i)packssdw(auVar29,auVar50);
  x[5] = alVar49;
  x[6] = alVar30;
  alVar30 = (__m128i)paddsw((undefined1  [16])alVar3,(undefined1  [16])x[0xb]);
  x[8] = alVar30;
  alVar30 = (__m128i)psubsw((undefined1  [16])alVar3,(undefined1  [16])x[0xb]);
  x[0xb] = alVar30;
  alVar30 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[10]);
  x[9] = alVar30;
  alVar30 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[10]);
  x[10] = alVar30;
  alVar30 = x[0xc];
  alVar3 = (__m128i)psubsw((undefined1  [16])x[0xf],(undefined1  [16])alVar30);
  x[0xc] = alVar3;
  alVar30 = (__m128i)paddsw((undefined1  [16])x[0xf],(undefined1  [16])alVar30);
  x[0xf] = alVar30;
  alVar30 = x[0xd];
  alVar3 = (__m128i)psubsw((undefined1  [16])x[0xe],(undefined1  [16])alVar30);
  x[0xd] = alVar3;
  alVar30 = (__m128i)paddsw((undefined1  [16])x[0xe],(undefined1  [16])alVar30);
  x[0xe] = alVar30;
  alVar30 = x[0x12];
  auVar7._0_12_ = alVar30._0_12_;
  auVar7._12_2_ = alVar30[0]._6_2_;
  auVar7._14_2_ = *(undefined2 *)((long)x[0x1d] + 6);
  auVar6._12_4_ = auVar7._12_4_;
  auVar6._0_10_ = alVar30._0_10_;
  auVar6._10_2_ = *(undefined2 *)((long)x[0x1d] + 4);
  auVar5._10_6_ = auVar6._10_6_;
  auVar5._0_8_ = alVar30[0];
  auVar5._8_2_ = alVar30[0]._4_2_;
  auVar4._8_8_ = auVar5._8_8_;
  auVar4._6_2_ = *(undefined2 *)((long)x[0x1d] + 2);
  auVar4._4_2_ = alVar30[0]._2_2_;
  auVar4._0_2_ = (undefined2)alVar30[0];
  auVar4._2_2_ = (short)x[0x1d][0];
  auVar31._2_2_ = (short)x[0x1d][1];
  auVar31._0_2_ = (short)alVar30[1];
  auVar31._4_2_ = alVar30[1]._2_2_;
  auVar31._6_2_ = *(undefined2 *)((long)x[0x1d] + 10);
  auVar31._8_2_ = alVar30[1]._4_2_;
  auVar31._10_2_ = *(undefined2 *)((long)x[0x1d] + 0xc);
  auVar31._12_2_ = alVar30[1]._6_2_;
  auVar31._14_2_ = *(undefined2 *)((long)x[0x1d] + 0xe);
  auVar2._8_4_ = 0x61ff138;
  auVar2._0_8_ = 0x61ff138061ff138;
  auVar2._12_4_ = 0x61ff138;
  auVar42 = pmaddwd(auVar4,auVar2);
  auVar50 = pmaddwd(auVar31,auVar2);
  auVar28._8_4_ = 0xec8061f;
  auVar28._0_8_ = 0xec8061f0ec8061f;
  auVar28._12_4_ = 0xec8061f;
  auVar40 = pmaddwd(auVar4,auVar28);
  auVar47 = pmaddwd(auVar31,auVar28);
  auVar43._0_4_ = auVar42._0_4_ + in_XMM0_Da >> 0xc;
  auVar43._4_4_ = auVar42._4_4_ + in_XMM0_Db >> 0xc;
  auVar43._8_4_ = auVar42._8_4_ + in_XMM0_Dc >> 0xc;
  auVar43._12_4_ = auVar42._12_4_ + in_XMM0_Dd >> 0xc;
  auVar51._0_4_ = auVar50._0_4_ + in_XMM0_Da >> 0xc;
  auVar51._4_4_ = auVar50._4_4_ + in_XMM0_Db >> 0xc;
  auVar51._8_4_ = auVar50._8_4_ + in_XMM0_Dc >> 0xc;
  auVar51._12_4_ = auVar50._12_4_ + in_XMM0_Dd >> 0xc;
  alVar3 = (__m128i)packssdw(auVar43,auVar51);
  auVar8._0_4_ = auVar40._0_4_ + in_XMM0_Da >> 0xc;
  auVar8._4_4_ = auVar40._4_4_ + in_XMM0_Db >> 0xc;
  auVar8._8_4_ = auVar40._8_4_ + in_XMM0_Dc >> 0xc;
  auVar8._12_4_ = auVar40._12_4_ + in_XMM0_Dd >> 0xc;
  auVar32._0_4_ = auVar47._0_4_ + in_XMM0_Da >> 0xc;
  auVar32._4_4_ = auVar47._4_4_ + in_XMM0_Db >> 0xc;
  auVar32._8_4_ = auVar47._8_4_ + in_XMM0_Dc >> 0xc;
  auVar32._12_4_ = auVar47._12_4_ + in_XMM0_Dd >> 0xc;
  alVar30 = (__m128i)packssdw(auVar8,auVar32);
  x[0x12] = alVar3;
  x[0x1d] = alVar30;
  alVar30 = x[0x13];
  auVar12._0_12_ = alVar30._0_12_;
  auVar12._12_2_ = alVar30[0]._6_2_;
  auVar12._14_2_ = *(undefined2 *)((long)x[0x1c] + 6);
  auVar11._12_4_ = auVar12._12_4_;
  auVar11._0_10_ = alVar30._0_10_;
  auVar11._10_2_ = *(undefined2 *)((long)x[0x1c] + 4);
  auVar10._10_6_ = auVar11._10_6_;
  auVar10._0_8_ = alVar30[0];
  auVar10._8_2_ = alVar30[0]._4_2_;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._6_2_ = *(undefined2 *)((long)x[0x1c] + 2);
  auVar9._4_2_ = alVar30[0]._2_2_;
  auVar9._0_2_ = (undefined2)alVar30[0];
  auVar9._2_2_ = (short)x[0x1c][0];
  auVar33._2_2_ = (short)x[0x1c][1];
  auVar33._0_2_ = (short)alVar30[1];
  auVar33._4_2_ = alVar30[1]._2_2_;
  auVar33._6_2_ = *(undefined2 *)((long)x[0x1c] + 10);
  auVar33._8_2_ = alVar30[1]._4_2_;
  auVar33._10_2_ = *(undefined2 *)((long)x[0x1c] + 0xc);
  auVar33._12_2_ = alVar30[1]._6_2_;
  auVar33._14_2_ = *(undefined2 *)((long)x[0x1c] + 0xe);
  auVar47 = pmaddwd(auVar9,auVar2);
  auVar42 = pmaddwd(auVar33,auVar2);
  auVar40 = pmaddwd(auVar9,auVar28);
  auVar28 = pmaddwd(auVar33,auVar28);
  auVar44._0_4_ = auVar47._0_4_ + in_XMM0_Da >> 0xc;
  auVar44._4_4_ = auVar47._4_4_ + in_XMM0_Db >> 0xc;
  auVar44._8_4_ = auVar47._8_4_ + in_XMM0_Dc >> 0xc;
  auVar44._12_4_ = auVar47._12_4_ + in_XMM0_Dd >> 0xc;
  auVar52._0_4_ = auVar42._0_4_ + in_XMM0_Da >> 0xc;
  auVar52._4_4_ = auVar42._4_4_ + in_XMM0_Db >> 0xc;
  auVar52._8_4_ = auVar42._8_4_ + in_XMM0_Dc >> 0xc;
  auVar52._12_4_ = auVar42._12_4_ + in_XMM0_Dd >> 0xc;
  alVar3 = (__m128i)packssdw(auVar44,auVar52);
  auVar13._0_4_ = auVar40._0_4_ + in_XMM0_Da >> 0xc;
  auVar13._4_4_ = auVar40._4_4_ + in_XMM0_Db >> 0xc;
  auVar13._8_4_ = auVar40._8_4_ + in_XMM0_Dc >> 0xc;
  auVar13._12_4_ = auVar40._12_4_ + in_XMM0_Dd >> 0xc;
  auVar34._0_4_ = auVar28._0_4_ + in_XMM0_Da >> 0xc;
  auVar34._4_4_ = auVar28._4_4_ + in_XMM0_Db >> 0xc;
  auVar34._8_4_ = auVar28._8_4_ + in_XMM0_Dc >> 0xc;
  auVar34._12_4_ = auVar28._12_4_ + in_XMM0_Dd >> 0xc;
  alVar30 = (__m128i)packssdw(auVar13,auVar34);
  x[0x13] = alVar3;
  x[0x1c] = alVar30;
  alVar30 = x[0x14];
  auVar17._0_12_ = alVar30._0_12_;
  auVar17._12_2_ = alVar30[0]._6_2_;
  auVar17._14_2_ = *(undefined2 *)((long)x[0x1b] + 6);
  auVar16._12_4_ = auVar17._12_4_;
  auVar16._0_10_ = alVar30._0_10_;
  auVar16._10_2_ = *(undefined2 *)((long)x[0x1b] + 4);
  auVar15._10_6_ = auVar16._10_6_;
  auVar15._0_8_ = alVar30[0];
  auVar15._8_2_ = alVar30[0]._4_2_;
  auVar14._8_8_ = auVar15._8_8_;
  auVar14._6_2_ = *(undefined2 *)((long)x[0x1b] + 2);
  auVar14._4_2_ = alVar30[0]._2_2_;
  auVar14._0_2_ = (undefined2)alVar30[0];
  auVar14._2_2_ = (short)x[0x1b][0];
  auVar35._2_2_ = (short)x[0x1b][1];
  auVar35._0_2_ = (short)alVar30[1];
  auVar35._4_2_ = alVar30[1]._2_2_;
  auVar35._6_2_ = *(undefined2 *)((long)x[0x1b] + 10);
  auVar35._8_2_ = alVar30[1]._4_2_;
  auVar35._10_2_ = *(undefined2 *)((long)x[0x1b] + 0xc);
  auVar35._12_2_ = alVar30[1]._6_2_;
  auVar35._14_2_ = *(undefined2 *)((long)x[0x1b] + 0xe);
  auVar40._8_4_ = 0xf138f9e1;
  auVar40._0_8_ = 0xf138f9e1f138f9e1;
  auVar40._12_4_ = 0xf138f9e1;
  auVar42 = pmaddwd(auVar14,auVar40);
  auVar50 = pmaddwd(auVar35,auVar40);
  auVar28 = pmaddwd(auVar14,auVar2);
  auVar47 = pmaddwd(auVar35,auVar2);
  auVar45._0_4_ = auVar42._0_4_ + in_XMM0_Da >> 0xc;
  auVar45._4_4_ = auVar42._4_4_ + in_XMM0_Db >> 0xc;
  auVar45._8_4_ = auVar42._8_4_ + in_XMM0_Dc >> 0xc;
  auVar45._12_4_ = auVar42._12_4_ + in_XMM0_Dd >> 0xc;
  auVar53._0_4_ = auVar50._0_4_ + in_XMM0_Da >> 0xc;
  auVar53._4_4_ = auVar50._4_4_ + in_XMM0_Db >> 0xc;
  auVar53._8_4_ = auVar50._8_4_ + in_XMM0_Dc >> 0xc;
  auVar53._12_4_ = auVar50._12_4_ + in_XMM0_Dd >> 0xc;
  alVar3 = (__m128i)packssdw(auVar45,auVar53);
  auVar18._0_4_ = auVar28._0_4_ + in_XMM0_Da >> 0xc;
  auVar18._4_4_ = auVar28._4_4_ + in_XMM0_Db >> 0xc;
  auVar18._8_4_ = auVar28._8_4_ + in_XMM0_Dc >> 0xc;
  auVar18._12_4_ = auVar28._12_4_ + in_XMM0_Dd >> 0xc;
  auVar36._0_4_ = auVar47._0_4_ + in_XMM0_Da >> 0xc;
  auVar36._4_4_ = auVar47._4_4_ + in_XMM0_Db >> 0xc;
  auVar36._8_4_ = auVar47._8_4_ + in_XMM0_Dc >> 0xc;
  auVar36._12_4_ = auVar47._12_4_ + in_XMM0_Dd >> 0xc;
  alVar30 = (__m128i)packssdw(auVar18,auVar36);
  x[0x14] = alVar3;
  x[0x1b] = alVar30;
  alVar30 = x[0x15];
  auVar22._0_12_ = alVar30._0_12_;
  auVar22._12_2_ = alVar30[0]._6_2_;
  auVar22._14_2_ = *(undefined2 *)((long)x[0x1a] + 6);
  auVar21._12_4_ = auVar22._12_4_;
  auVar21._0_10_ = alVar30._0_10_;
  auVar21._10_2_ = *(undefined2 *)((long)x[0x1a] + 4);
  auVar20._10_6_ = auVar21._10_6_;
  auVar20._0_8_ = alVar30[0];
  auVar20._8_2_ = alVar30[0]._4_2_;
  auVar19._8_8_ = auVar20._8_8_;
  auVar19._6_2_ = *(undefined2 *)((long)x[0x1a] + 2);
  auVar19._4_2_ = alVar30[0]._2_2_;
  auVar19._0_2_ = (undefined2)alVar30[0];
  auVar19._2_2_ = (short)x[0x1a][0];
  auVar37._2_2_ = (short)x[0x1a][1];
  auVar37._0_2_ = (short)alVar30[1];
  auVar37._4_2_ = alVar30[1]._2_2_;
  auVar37._6_2_ = *(undefined2 *)((long)x[0x1a] + 10);
  auVar37._8_2_ = alVar30[1]._4_2_;
  auVar37._10_2_ = *(undefined2 *)((long)x[0x1a] + 0xc);
  auVar37._12_2_ = alVar30[1]._6_2_;
  auVar37._14_2_ = *(undefined2 *)((long)x[0x1a] + 0xe);
  auVar47 = pmaddwd(auVar19,auVar40);
  auVar28 = pmaddwd(auVar40,auVar37);
  auVar40 = pmaddwd(auVar19,auVar2);
  auVar2 = pmaddwd(auVar37,auVar2);
  auVar46._0_4_ = auVar47._0_4_ + in_XMM0_Da >> 0xc;
  auVar46._4_4_ = auVar47._4_4_ + in_XMM0_Db >> 0xc;
  auVar46._8_4_ = auVar47._8_4_ + in_XMM0_Dc >> 0xc;
  auVar46._12_4_ = auVar47._12_4_ + in_XMM0_Dd >> 0xc;
  auVar47._0_4_ = auVar28._0_4_ + in_XMM0_Da >> 0xc;
  auVar47._4_4_ = auVar28._4_4_ + in_XMM0_Db >> 0xc;
  auVar47._8_4_ = auVar28._8_4_ + in_XMM0_Dc >> 0xc;
  auVar47._12_4_ = auVar28._12_4_ + in_XMM0_Dd >> 0xc;
  alVar3 = (__m128i)packssdw(auVar46,auVar47);
  auVar23._0_4_ = auVar40._0_4_ + in_XMM0_Da >> 0xc;
  auVar23._4_4_ = auVar40._4_4_ + in_XMM0_Db >> 0xc;
  auVar23._8_4_ = auVar40._8_4_ + in_XMM0_Dc >> 0xc;
  auVar23._12_4_ = auVar40._12_4_ + in_XMM0_Dd >> 0xc;
  auVar38._0_4_ = auVar2._0_4_ + in_XMM0_Da >> 0xc;
  auVar38._4_4_ = auVar2._4_4_ + in_XMM0_Db >> 0xc;
  auVar38._8_4_ = auVar2._8_4_ + in_XMM0_Dc >> 0xc;
  auVar38._12_4_ = auVar2._12_4_ + in_XMM0_Dd >> 0xc;
  alVar30 = (__m128i)packssdw(auVar23,auVar38);
  x[0x15] = alVar3;
  x[0x1a] = alVar30;
  return;
}

Assistant:

static inline void idct32_high28_stage6_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[18], x[29], x[18], x[29]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[19], x[28], x[19], x[28]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[20], x[27], x[20], x[27]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[21], x[26], x[21], x[26]);
}